

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::TraverseSchema::isIdentityConstraintName(TraverseSchema *this,XMLCh *name)

{
  bool bVar1;
  bool local_19;
  XMLCh *name_local;
  TraverseSchema *this_local;
  
  bVar1 = XMLString::equals(name,L"key");
  local_19 = true;
  if (!bVar1) {
    bVar1 = XMLString::equals(name,(XMLCh *)SchemaSymbols::fgELT_KEYREF);
    local_19 = true;
    if (!bVar1) {
      local_19 = XMLString::equals(name,(XMLCh *)SchemaSymbols::fgELT_UNIQUE);
    }
  }
  return local_19;
}

Assistant:

bool TraverseSchema::isIdentityConstraintName(const XMLCh* const name) {

    return (XMLString::equals(name, SchemaSymbols::fgELT_KEY)
            || XMLString::equals(name, SchemaSymbols::fgELT_KEYREF)
            || XMLString::equals(name, SchemaSymbols::fgELT_UNIQUE));
}